

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_def.c
# Opt level: O1

_Bool upb_MessageDef_FindByNameWithSize
                (upb_MessageDef *m,char *name,size_t len,upb_FieldDef **out_f,upb_OneofDef **out_o)

{
  _Bool _Var1;
  bool bVar2;
  upb_FieldDef *puVar3;
  upb_OneofDef *puVar4;
  upb_value val;
  upb_value local_20;
  
  _Var1 = upb_strtable_lookup2(&m->ntof,name,len,&local_20);
  if (_Var1) {
    puVar3 = (upb_FieldDef *)_upb_DefType_Unpack(local_20,UPB_DEFTYPE_EXT);
    puVar4 = (upb_OneofDef *)_upb_DefType_Unpack(local_20,UPB_DEFTYPE_MSG);
    if (out_f != (upb_FieldDef **)0x0) {
      *out_f = puVar3;
    }
    if (out_o != (upb_OneofDef **)0x0) {
      *out_o = puVar4;
    }
    bVar2 = puVar3 != (upb_FieldDef *)0x0 || puVar4 != (upb_OneofDef *)0x0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool upb_MessageDef_FindByNameWithSize(const upb_MessageDef* m,
                                       const char* name, size_t len,
                                       const upb_FieldDef** out_f,
                                       const upb_OneofDef** out_o) {
  upb_value val;

  if (!upb_strtable_lookup2(&m->ntof, name, len, &val)) {
    return false;
  }

  const upb_FieldDef* f = _upb_DefType_Unpack(val, UPB_DEFTYPE_FIELD);
  const upb_OneofDef* o = _upb_DefType_Unpack(val, UPB_DEFTYPE_ONEOF);
  if (out_f) *out_f = f;
  if (out_o) *out_o = o;
  return f || o; /* False if this was a JSON name. */
}